

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O1

SQRESULT sqstd_loadfile(HSQUIRRELVM v,SQChar *filename,SQBool printerror)

{
  FILE *__stream;
  size_t sVar1;
  long lVar2;
  SQRESULT SVar3;
  code *read;
  char *err;
  uchar uc;
  unsigned_short us;
  char local_83b;
  ushort local_83a;
  undefined1 local_838 [2048];
  undefined8 local_38;
  undefined8 uStack_30;
  FILE *local_28;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    err = "cannot open the file";
    goto LAB_001342f1;
  }
  sVar1 = fread(&local_83a,1,2,__stream);
  if (sVar1 != 2) {
    local_83a = 0;
  }
  if (local_83a < 0xfeff) {
    if (local_83a == 0xbbef) {
      sVar1 = fread(&local_83b,1,1,__stream);
      if (sVar1 == 0) {
        fclose(__stream);
        err = "io error";
LAB_001342f1:
        SVar3 = sq_throwerror(v,err);
        return SVar3;
      }
      if (local_83b != -0x41) {
        fclose(__stream);
        err = "Unrecognized encoding";
        goto LAB_001342f1;
      }
    }
    else {
      if (local_83a == 0xfafa) {
        fseek(__stream,0,0);
        lVar2 = sq_readclosure(v,file_read,__stream);
        goto LAB_00134383;
      }
LAB_0013431e:
      fseek(__stream,0,0);
    }
    read = _io_file_lexfeed_PLAIN;
  }
  else if (local_83a == 0xfeff) {
    read = _io_file_lexfeed_UCS2_LE;
  }
  else {
    if (local_83a != 0xfffe) goto LAB_0013431e;
    read = _io_file_lexfeed_UCS2_BE;
  }
  local_38 = 0;
  uStack_30 = 0;
  local_28 = __stream;
  lVar2 = sq_compile(v,read,local_838,filename,printerror);
LAB_00134383:
  if (lVar2 < 0) {
    fclose(__stream);
    SVar3 = -1;
  }
  else {
    fclose(__stream);
    SVar3 = 0;
  }
  return SVar3;
}

Assistant:

SQRESULT sqstd_loadfile(HSQUIRRELVM v,const SQChar *filename,SQBool printerror)
{
    SQFILE file = sqstd_fopen(filename,_SC("rb"));

    SQInteger ret;
    unsigned short us;
    unsigned char uc;
    SQLEXREADFUNC func = _io_file_lexfeed_PLAIN;
    if(file){
        ret = sqstd_fread(&us,1,2,file);
        if(ret != 2) {
            //probably an empty file
            us = 0;
        }
        if(us == SQ_BYTECODE_STREAM_TAG) { //BYTECODE
            sqstd_fseek(file,0,SQ_SEEK_SET);
            if(SQ_SUCCEEDED(sq_readclosure(v,file_read,file))) {
                sqstd_fclose(file);
                return SQ_OK;
            }
        }
        else { //SCRIPT

            switch(us)
            {
                //gotta swap the next 2 lines on BIG endian machines
                case 0xFFFE: func = _io_file_lexfeed_UCS2_BE; break;//UTF-16 little endian;
                case 0xFEFF: func = _io_file_lexfeed_UCS2_LE; break;//UTF-16 big endian;
                case 0xBBEF:
                    if(sqstd_fread(&uc,1,sizeof(uc),file) == 0) {
                        sqstd_fclose(file);
                        return sq_throwerror(v,_SC("io error"));
                    }
                    if(uc != 0xBF) {
                        sqstd_fclose(file);
                        return sq_throwerror(v,_SC("Unrecognized encoding"));
                    }
#ifdef SQUNICODE
                    func = _io_file_lexfeed_UTF8;
#else
                    func = _io_file_lexfeed_PLAIN;
#endif
                    break;//UTF-8 ;
                default: sqstd_fseek(file,0,SQ_SEEK_SET); break; // ascii
            }
            IOBuffer buffer;
            buffer.ptr = 0;
            buffer.size = 0;
            buffer.file = file;
            if(SQ_SUCCEEDED(sq_compile(v,func,&buffer,filename,printerror))){
                sqstd_fclose(file);
                return SQ_OK;
            }
        }
        sqstd_fclose(file);
        return SQ_ERROR;
    }
    return sq_throwerror(v,_SC("cannot open the file"));
}